

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  iterator iVar1;
  pointer ppVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  size_type expected_bucknum;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  pair<const_char_*const,_ValueType> local_88;
  size_type local_78;
  pair<google::sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_70;
  
  local_70.first.ht =
       (sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this,1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  pVar3 = google::
          sparse_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((sparse_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)this_00,(char **)&local_70);
  local_78 = pVar3.second;
  if (pVar3.first != 0xffffffffffffffff) {
    local_78 = pVar3.first;
  }
  local_90.data_ = (AssertHelperData *)((ulong)local_90.data_._4_4_ << 0x20);
  local_88.first =
       (char *)google::
               sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::bucket_size(&this_00->rep,local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"0u","this->ht_.bucket_size(expected_bucknum)",(uint *)&local_90,
             (unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar2 = (pointer)0xaf1463;
    }
    else {
      ppVar2 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x254,(char *)ppVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_88.first != (long *)0x0) {
      (**(code **)(*(long *)local_88.first + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  UniqueObjectHelper<std::pair<char_const*const,ValueType>>((int)&local_88);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_70,&this_00->rep,&local_88);
  if (local_88.second.s_ != "hi") {
    free(local_88.second.s_);
  }
  local_90.data_ =
       (AssertHelperData *)
       HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this,1);
  pVar3 = google::
          sparse_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((sparse_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)this_00,(char **)&local_90);
  local_88.first = (char *)pVar3.second;
  if ((long *)pVar3.first != (long *)0xffffffffffffffff) {
    local_88.first = (char *)pVar3.first;
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_70,"expected_bucknum","this->ht_.bucket(this->UniqueKey(1))",
             &local_78,(unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar2 = (pointer)0xaf1463;
    }
    else {
      ppVar2 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,599,(char *)ppVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_88.first != (long *)0x0) {
      (**(code **)(*(long *)local_88.first + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_90.data_._0_4_ = 1;
  local_88.first =
       (char *)google::
               sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::bucket_size(&this_00->rep,local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"1u","this->ht_.bucket_size(expected_bucknum)",(uint *)&local_90,
             (unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar2 = (pointer)0xaf1463;
    }
    else {
      ppVar2 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,600,(char *)ppVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_88.first != (long *)0x0) {
      (**(code **)(*(long *)local_88.first + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  local_88.first =
       (char *)google::
               sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::bucket_size(&this_00->rep,local_78 ^ 1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"0u","this->ht_.bucket_size(expected_bucknum ^ 1)",
             (uint *)&local_90,(unsigned_long *)&local_88);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar2 = (pointer)0xaf1463;
    }
    else {
      ppVar2 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x25c,(char *)ppVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_88.first != (long *)0x0) {
      (**(code **)(*(long *)local_88.first + 8))();
    }
  }
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_70.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_70.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                  .
                  super_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(local_70.first.pos.row_begin._M_current);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}